

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O2

BBox3fa * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
::vbounds(BBox3fa *__return_storage_ptr__,
         CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx512::CurveGeometryInterface,_embree::BSplineCurveT>
         *this,Vec3fa *ofs,float scale,float r_scale0,LinearSpace3fa *space,size_t i,size_t itime)

{
  float fVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  bool bVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  ulong uVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined4 uVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [32];
  undefined1 auVar71 [64];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [32];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [32];
  undefined4 uVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [16];
  
  fVar17 = scale * r_scale0;
  pBVar6 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.vertices.
           items;
  uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                              super_CurveGeometry.super_Geometry.field_0x58 +
                   i * *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                 super_CurveGeometry.field_0x68);
  pcVar7 = pBVar6[itime].super_RawBufferView.ptr_ofs;
  sVar8 = pBVar6[itime].super_RawBufferView.stride;
  lVar31 = (uVar5 + 1) * sVar8;
  lVar30 = (uVar5 + 2) * sVar8;
  lVar29 = (uVar5 + 3) * sVar8;
  aVar2 = ofs->field_0;
  auVar37 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + uVar5 * sVar8),(undefined1  [16])aVar2);
  auVar40._0_4_ = scale * auVar37._0_4_;
  auVar40._4_4_ = scale * auVar37._4_4_;
  auVar40._8_4_ = scale * auVar37._8_4_;
  auVar40._12_4_ = scale * auVar37._12_4_;
  auVar78._4_4_ = auVar40._0_4_;
  auVar78._0_4_ = auVar40._0_4_;
  auVar78._8_4_ = auVar40._0_4_;
  auVar78._12_4_ = auVar40._0_4_;
  auVar37 = vshufps_avx(auVar40,auVar40,0x55);
  aVar3 = (space->vx).field_0;
  auVar42 = vshufps_avx(auVar40,auVar40,0xaa);
  aVar4 = (space->vy).field_0;
  fVar25 = (space->vz).field_0.m128[0];
  fVar26 = (space->vz).field_0.m128[1];
  fVar27 = (space->vz).field_0.m128[2];
  fVar28 = (space->vz).field_0.m128[3];
  auVar77._0_4_ = fVar25 * auVar42._0_4_;
  auVar77._4_4_ = fVar26 * auVar42._4_4_;
  auVar77._8_4_ = fVar27 * auVar42._8_4_;
  auVar77._12_4_ = fVar28 * auVar42._12_4_;
  auVar37 = vfmadd231ps_fma(auVar77,(undefined1  [16])aVar4,auVar37);
  auVar40 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar78);
  fVar1 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
          maxRadiusScale;
  fVar18 = fVar17 * fVar1 * *(float *)(pcVar7 + uVar5 * sVar8 + 0xc);
  auVar37 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar31),(undefined1  [16])aVar2);
  auVar41._0_4_ = scale * auVar37._0_4_;
  auVar41._4_4_ = scale * auVar37._4_4_;
  auVar41._8_4_ = scale * auVar37._8_4_;
  auVar41._12_4_ = scale * auVar37._12_4_;
  auVar34._4_4_ = auVar41._0_4_;
  auVar34._0_4_ = auVar41._0_4_;
  auVar34._8_4_ = auVar41._0_4_;
  auVar34._12_4_ = auVar41._0_4_;
  auVar37 = vshufps_avx(auVar41,auVar41,0x55);
  auVar42 = vshufps_avx(auVar41,auVar41,0xaa);
  auVar32._0_4_ = fVar25 * auVar42._0_4_;
  auVar32._4_4_ = fVar26 * auVar42._4_4_;
  auVar32._8_4_ = fVar27 * auVar42._8_4_;
  auVar32._12_4_ = fVar28 * auVar42._12_4_;
  auVar37 = vfmadd231ps_fma(auVar32,(undefined1  [16])aVar4,auVar37);
  auVar41 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar34);
  fVar19 = fVar17 * fVar1 * *(float *)(pcVar7 + lVar31 + 0xc);
  auVar37 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar30),(undefined1  [16])aVar2);
  auVar39._0_4_ = scale * auVar37._0_4_;
  auVar39._4_4_ = scale * auVar37._4_4_;
  auVar39._8_4_ = scale * auVar37._8_4_;
  auVar39._12_4_ = scale * auVar37._12_4_;
  auVar33._4_4_ = auVar39._0_4_;
  auVar33._0_4_ = auVar39._0_4_;
  auVar33._8_4_ = auVar39._0_4_;
  auVar33._12_4_ = auVar39._0_4_;
  auVar37 = vshufps_avx(auVar39,auVar39,0x55);
  auVar42 = vshufps_avx(auVar39,auVar39,0xaa);
  auVar35._0_4_ = fVar25 * auVar42._0_4_;
  auVar35._4_4_ = fVar26 * auVar42._4_4_;
  auVar35._8_4_ = fVar27 * auVar42._8_4_;
  auVar35._12_4_ = fVar28 * auVar42._12_4_;
  auVar37 = vfmadd231ps_fma(auVar35,(undefined1  [16])aVar4,auVar37);
  auVar39 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar33);
  fVar20 = fVar17 * fVar1 * *(float *)(pcVar7 + lVar30 + 0xc);
  auVar37 = vsubps_avx(*(undefined1 (*) [16])(pcVar7 + lVar29),(undefined1  [16])aVar2);
  auVar42._0_4_ = scale * auVar37._0_4_;
  auVar42._4_4_ = scale * auVar37._4_4_;
  auVar42._8_4_ = scale * auVar37._8_4_;
  auVar42._12_4_ = scale * auVar37._12_4_;
  auVar75._4_4_ = auVar42._0_4_;
  auVar75._0_4_ = auVar42._0_4_;
  auVar75._8_4_ = auVar42._0_4_;
  auVar75._12_4_ = auVar42._0_4_;
  auVar37 = vshufps_avx(auVar42,auVar42,0x55);
  auVar42 = vshufps_avx(auVar42,auVar42,0xaa);
  auVar36._0_4_ = fVar25 * auVar42._0_4_;
  auVar36._4_4_ = fVar26 * auVar42._4_4_;
  auVar36._8_4_ = fVar27 * auVar42._8_4_;
  auVar36._12_4_ = fVar28 * auVar42._12_4_;
  auVar37 = vfmadd231ps_fma(auVar36,(undefined1  [16])aVar4,auVar37);
  auVar37 = vfmadd231ps_fma(auVar37,(undefined1  [16])aVar3,auVar75);
  fVar17 = fVar17 * fVar1 * *(float *)(pcVar7 + lVar29 + 0xc);
  lVar29 = (long)(this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                 tessellationRate;
  uVar81 = auVar41._0_4_;
  uVar68 = auVar40._0_4_;
  if (lVar29 == 4) {
    auVar86._4_4_ = fVar17;
    auVar86._0_4_ = fVar17;
    auVar86._8_4_ = fVar17;
    auVar86._12_4_ = fVar17;
    auVar42 = vblendps_avx(auVar37,auVar86,8);
    auVar84._4_4_ = fVar20;
    auVar84._0_4_ = fVar20;
    auVar84._8_4_ = fVar20;
    auVar84._12_4_ = fVar20;
    auVar75 = vblendps_avx(auVar39,auVar84,8);
    auVar76._4_4_ = fVar19;
    auVar76._0_4_ = fVar19;
    auVar76._8_4_ = fVar19;
    auVar76._12_4_ = fVar19;
    auVar77 = vblendps_avx(auVar41,auVar76,8);
    auVar87._4_4_ = uVar68;
    auVar87._0_4_ = uVar68;
    auVar87._8_4_ = uVar68;
    auVar87._12_4_ = uVar68;
    auVar78 = vshufps_avx(auVar40,auVar40,0x55);
    auVar40 = vshufps_avx(auVar40,auVar40,0xaa);
    auVar79._4_4_ = fVar18;
    auVar79._0_4_ = fVar18;
    auVar79._8_4_ = fVar18;
    auVar79._12_4_ = fVar18;
    auVar90._4_4_ = uVar81;
    auVar90._0_4_ = uVar81;
    auVar90._8_4_ = uVar81;
    auVar90._12_4_ = uVar81;
    auVar32 = vshufps_avx512vl(auVar41,auVar41,0x55);
    auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
    auVar33 = vbroadcastss_avx512vl(auVar39);
    auVar34 = vshufps_avx512vl(auVar39,auVar39,0x55);
    auVar39 = vshufps_avx(auVar39,auVar39,0xaa);
    auVar35 = vbroadcastss_avx512vl(auVar37);
    auVar36 = vshufps_avx512vl(auVar37,auVar37,0x55);
    auVar37 = vshufps_avx(auVar37,auVar37,0xaa);
    auVar35 = vmulps_avx512vl(auVar35,bspline_basis0._3740_16_);
    auVar36 = vmulps_avx512vl(auVar36,bspline_basis0._3740_16_);
    auVar37 = vmulps_avx512vl(auVar37,bspline_basis0._3740_16_);
    auVar38 = vmulps_avx512vl(auVar86,bspline_basis0._3740_16_);
    auVar33 = vfmadd231ps_avx512vl(auVar35,bspline_basis0._2584_16_,auVar33);
    auVar34 = vfmadd231ps_avx512vl(auVar36,bspline_basis0._2584_16_,auVar34);
    auVar37 = vfmadd231ps_avx512vl(auVar37,bspline_basis0._2584_16_,auVar39);
    auVar39 = vfmadd231ps_avx512vl(auVar38,bspline_basis0._2584_16_,auVar84);
    auVar33 = vfmadd231ps_avx512vl(auVar33,bspline_basis0._1428_16_,auVar90);
    auVar32 = vfmadd231ps_avx512vl(auVar34,bspline_basis0._1428_16_,auVar32);
    auVar37 = vfmadd231ps_fma(auVar37,bspline_basis0._1428_16_,auVar41);
    auVar41 = vfmadd231ps_fma(auVar39,bspline_basis0._1428_16_,auVar76);
    auVar33 = vfmadd231ps_avx512vl(auVar33,bspline_basis0._272_16_,auVar87);
    auVar34 = vfmadd231ps_avx512vl(auVar32,bspline_basis0._272_16_,auVar78);
    auVar78 = vfmadd231ps_fma(auVar37,bspline_basis0._272_16_,auVar40);
    auVar32 = vfmadd231ps_fma(auVar41,bspline_basis0._272_16_,auVar79);
    auVar35 = vshufps_avx512vl(auVar33,auVar33,0xb1);
    auVar40 = vminps_avx512vl(auVar35,auVar33);
    auVar37 = vshufpd_avx(auVar40,auVar40,1);
    auVar37 = vminps_avx(auVar37,auVar40);
    auVar36 = vshufps_avx512vl(auVar34,auVar34,0xb1);
    auVar41 = vminps_avx512vl(auVar36,auVar34);
    auVar40 = vshufpd_avx(auVar41,auVar41,1);
    auVar40 = vminps_avx(auVar40,auVar41);
    auVar37 = vinsertps_avx(auVar37,auVar40,0x1c);
    auVar39 = vshufps_avx(auVar78,auVar78,0xb1);
    auVar40 = vminps_avx(auVar39,auVar78);
    auVar41 = vshufpd_avx(auVar40,auVar40,1);
    auVar40 = vminps_avx(auVar41,auVar40);
    auVar37 = vinsertps_avx(auVar37,auVar40,0x20);
    auVar41 = vmaxps_avx512vl(auVar35,auVar33);
    auVar40 = vshufpd_avx(auVar41,auVar41,1);
    auVar40 = vmaxps_avx(auVar40,auVar41);
    auVar33 = vmaxps_avx512vl(auVar36,auVar34);
    auVar41 = vshufpd_avx(auVar33,auVar33,1);
    auVar41 = vmaxps_avx(auVar41,auVar33);
    auVar40 = vinsertps_avx(auVar40,auVar41,0x1c);
    auVar41 = vmaxps_avx(auVar39,auVar78);
    auVar39 = vshufpd_avx(auVar41,auVar41,1);
    auVar41 = vmaxps_avx(auVar39,auVar41);
    auVar40 = vinsertps_avx(auVar40,auVar41,0x20);
    auVar22._8_4_ = 0x7fffffff;
    auVar22._0_8_ = 0x7fffffff7fffffff;
    auVar22._12_4_ = 0x7fffffff;
    auVar41 = vandps_avx512vl(auVar32,auVar22);
    auVar39 = vprolq_avx512vl(auVar41,0x20);
    auVar41 = vmaxps_avx(auVar39,auVar41);
    uVar68 = auVar41._0_4_;
    auVar82._4_4_ = uVar68;
    auVar82._0_4_ = uVar68;
    auVar82._8_4_ = uVar68;
    auVar82._12_4_ = uVar68;
    auVar41 = vshufps_avx(auVar41,auVar41,0xaa);
    auVar41 = vmaxps_avx(auVar41,auVar82);
    auVar83._8_4_ = 0x3e2aaaab;
    auVar83._0_8_ = 0x3e2aaaab3e2aaaab;
    auVar83._12_4_ = 0x3e2aaaab;
    auVar69._0_4_ = auVar42._0_4_ * 0.16666667;
    auVar69._4_4_ = auVar42._4_4_ * 0.16666667;
    auVar69._8_4_ = auVar42._8_4_ * 0.16666667;
    auVar69._12_4_ = auVar42._12_4_ * 0.16666667;
    auVar23._8_4_ = 0x3f2aaaab;
    auVar23._0_8_ = 0x3f2aaaab3f2aaaab;
    auVar23._12_4_ = 0x3f2aaaab;
    auVar42 = vfmadd231ps_avx512vl(auVar69,auVar75,auVar23);
    auVar39 = vfmadd231ps_fma(auVar42,auVar83,auVar77);
    auVar37 = vminps_avx(auVar37,auVar39);
    auVar42 = vmaxps_avx(auVar40,auVar39);
    auVar40 = vshufps_avx(auVar39,auVar39,0xff);
    auVar24._8_4_ = 0x7fffffff;
    auVar24._0_8_ = 0x7fffffff7fffffff;
    auVar24._12_4_ = 0x7fffffff;
    auVar40 = vandps_avx512vl(auVar40,auVar24);
    auVar38 = vmaxps_avx(auVar41,auVar40);
  }
  else {
    auVar43 = vpbroadcastd_avx512vl();
    auVar74._4_4_ = uVar68;
    auVar74._0_4_ = uVar68;
    auVar74._8_4_ = uVar68;
    auVar74._12_4_ = uVar68;
    auVar74._16_4_ = uVar68;
    auVar74._20_4_ = uVar68;
    auVar74._24_4_ = uVar68;
    auVar74._28_4_ = uVar68;
    auVar44 = vbroadcastss_avx512vl(ZEXT416(1));
    auVar45 = vpermps_avx512vl(auVar44,ZEXT1632(auVar40));
    auVar46 = vbroadcastss_avx512vl(ZEXT416(2));
    auVar47 = vpermps_avx512vl(auVar46,ZEXT1632(auVar40));
    auVar80._4_4_ = fVar18;
    auVar80._0_4_ = fVar18;
    auVar80._8_4_ = fVar18;
    auVar80._12_4_ = fVar18;
    auVar80._16_4_ = fVar18;
    auVar80._20_4_ = fVar18;
    auVar80._24_4_ = fVar18;
    auVar80._28_4_ = fVar18;
    auVar85._4_4_ = uVar81;
    auVar85._0_4_ = uVar81;
    auVar85._8_4_ = uVar81;
    auVar85._12_4_ = uVar81;
    auVar85._16_4_ = uVar81;
    auVar85._20_4_ = uVar81;
    auVar85._24_4_ = uVar81;
    auVar85._28_4_ = uVar81;
    auVar48 = vpermps_avx512vl(auVar44,ZEXT1632(auVar41));
    auVar49 = vpermps_avx512vl(auVar46,ZEXT1632(auVar41));
    auVar88._4_4_ = fVar19;
    auVar88._0_4_ = fVar19;
    auVar88._8_4_ = fVar19;
    auVar88._12_4_ = fVar19;
    auVar88._16_4_ = fVar19;
    auVar88._20_4_ = fVar19;
    auVar88._24_4_ = fVar19;
    auVar88._28_4_ = fVar19;
    uVar68 = auVar39._0_4_;
    auVar89._4_4_ = uVar68;
    auVar89._0_4_ = uVar68;
    auVar89._8_4_ = uVar68;
    auVar89._12_4_ = uVar68;
    auVar89._16_4_ = uVar68;
    auVar89._20_4_ = uVar68;
    auVar89._24_4_ = uVar68;
    auVar89._28_4_ = uVar68;
    auVar50 = vpermps_avx512vl(auVar44,ZEXT1632(auVar39));
    auVar51 = vpermps_avx512vl(auVar46,ZEXT1632(auVar39));
    auVar52 = vbroadcastss_avx512vl(ZEXT416((uint)fVar20));
    auVar53 = vbroadcastss_avx512vl(auVar37);
    auVar54 = vpermps_avx512vl(auVar44,ZEXT1632(auVar37));
    auVar55 = vpermps_avx512vl(auVar46,ZEXT1632(auVar37));
    auVar56 = vbroadcastss_avx512vl(ZEXT416((uint)fVar17));
    lVar30 = lVar29 * 0x44;
    auVar57 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
    auVar44._8_4_ = 0xff800000;
    auVar44._0_8_ = 0xff800000ff800000;
    auVar44._12_4_ = 0xff800000;
    auVar44._16_4_ = 0xff800000;
    auVar44._20_4_ = 0xff800000;
    auVar44._24_4_ = 0xff800000;
    auVar44._28_4_ = 0xff800000;
    auVar71 = ZEXT864(0);
    lVar31 = 0;
    auVar58 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar46 = auVar44;
    auVar67 = auVar44;
    auVar65 = auVar57;
    auVar66 = auVar57;
    for (; auVar70 = auVar71._0_32_, lVar31 <= lVar29; lVar31 = lVar31 + 8) {
      auVar59 = vpbroadcastd_avx512vl();
      auVar59 = vpord_avx512vl(auVar59,_DAT_01fb4ba0);
      uVar21 = vpcmpgtd_avx512vl(auVar59,auVar43);
      auVar59 = *(undefined1 (*) [32])(lVar30 + 0x2200430 + lVar31 * 4);
      auVar63 = *(undefined1 (*) [32])(lVar30 + 0x22008b4 + lVar31 * 4);
      auVar60 = vmulps_avx512vl(auVar53,auVar63);
      auVar61 = vmulps_avx512vl(auVar54,auVar63);
      auVar62 = vmulps_avx512vl(auVar55,auVar63);
      auVar63 = vmulps_avx512vl(auVar56,auVar63);
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar59,auVar89);
      auVar61 = vfmadd231ps_avx512vl(auVar61,auVar59,auVar50);
      auVar62 = vfmadd231ps_avx512vl(auVar62,auVar59,auVar51);
      auVar63 = vfmadd231ps_avx512vl(auVar63,auVar52,auVar59);
      auVar59 = *(undefined1 (*) [32])(lVar30 + 0x21fffac + lVar31 * 4);
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar59,auVar85);
      auVar61 = vfmadd231ps_avx512vl(auVar61,auVar59,auVar48);
      auVar62 = vfmadd231ps_avx512vl(auVar62,auVar59,auVar49);
      auVar63 = vfmadd231ps_avx512vl(auVar63,auVar88,auVar59);
      auVar59 = *(undefined1 (*) [32])(bspline_basis0 + lVar31 * 4 + lVar30);
      auVar60 = vfmadd231ps_avx512vl(auVar60,auVar59,auVar74);
      auVar61 = vfmadd231ps_avx512vl(auVar61,auVar59,auVar45);
      auVar62 = vfmadd231ps_avx512vl(auVar62,auVar59,auVar47);
      auVar59 = vfmadd231ps_avx512vl(auVar63,auVar80,auVar59);
      auVar63 = vminps_avx512vl(auVar65,auVar60);
      bVar9 = (byte)uVar21;
      auVar64._0_4_ = (uint)(bVar9 & 1) * auVar65._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar63._0_4_;
      bVar10 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar64._4_4_ = (uint)bVar10 * auVar65._4_4_ | (uint)!bVar10 * auVar63._4_4_;
      bVar10 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar64._8_4_ = (uint)bVar10 * auVar65._8_4_ | (uint)!bVar10 * auVar63._8_4_;
      bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar64._12_4_ = (uint)bVar10 * auVar65._12_4_ | (uint)!bVar10 * auVar63._12_4_;
      bVar10 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar64._16_4_ = (uint)bVar10 * auVar65._16_4_ | (uint)!bVar10 * auVar63._16_4_;
      bVar10 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar64._20_4_ = (uint)bVar10 * auVar65._20_4_ | (uint)!bVar10 * auVar63._20_4_;
      bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar64._24_4_ = (uint)bVar10 * auVar65._24_4_ | (uint)!bVar10 * auVar63._24_4_;
      bVar10 = SUB81(uVar21 >> 7,0);
      auVar64._28_4_ = (uint)bVar10 * auVar65._28_4_ | (uint)!bVar10 * auVar63._28_4_;
      auVar65 = vminps_avx512vl(auVar66,auVar61);
      auVar63._0_4_ = (uint)(bVar9 & 1) * auVar66._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar65._0_4_;
      bVar10 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar63._4_4_ = (uint)bVar10 * auVar66._4_4_ | (uint)!bVar10 * auVar65._4_4_;
      bVar10 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar63._8_4_ = (uint)bVar10 * auVar66._8_4_ | (uint)!bVar10 * auVar65._8_4_;
      bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar63._12_4_ = (uint)bVar10 * auVar66._12_4_ | (uint)!bVar10 * auVar65._12_4_;
      bVar10 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar63._16_4_ = (uint)bVar10 * auVar66._16_4_ | (uint)!bVar10 * auVar65._16_4_;
      bVar10 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar63._20_4_ = (uint)bVar10 * auVar66._20_4_ | (uint)!bVar10 * auVar65._20_4_;
      bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar63._24_4_ = (uint)bVar10 * auVar66._24_4_ | (uint)!bVar10 * auVar65._24_4_;
      bVar10 = SUB81(uVar21 >> 7,0);
      auVar63._28_4_ = (uint)bVar10 * auVar66._28_4_ | (uint)!bVar10 * auVar65._28_4_;
      auVar66 = vminps_avx512vl(auVar57,auVar62);
      auVar65._0_4_ = (uint)(bVar9 & 1) * auVar57._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar66._0_4_;
      bVar10 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar65._4_4_ = (uint)bVar10 * auVar57._4_4_ | (uint)!bVar10 * auVar66._4_4_;
      bVar10 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar65._8_4_ = (uint)bVar10 * auVar57._8_4_ | (uint)!bVar10 * auVar66._8_4_;
      bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar65._12_4_ = (uint)bVar10 * auVar57._12_4_ | (uint)!bVar10 * auVar66._12_4_;
      bVar10 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar65._16_4_ = (uint)bVar10 * auVar57._16_4_ | (uint)!bVar10 * auVar66._16_4_;
      bVar10 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar65._20_4_ = (uint)bVar10 * auVar57._20_4_ | (uint)!bVar10 * auVar66._20_4_;
      bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar65._24_4_ = (uint)bVar10 * auVar57._24_4_ | (uint)!bVar10 * auVar66._24_4_;
      bVar10 = SUB81(uVar21 >> 7,0);
      auVar65._28_4_ = (uint)bVar10 * auVar57._28_4_ | (uint)!bVar10 * auVar66._28_4_;
      auVar66 = vmaxps_avx512vl(auVar46,auVar60);
      auVar57._0_4_ = (uint)(bVar9 & 1) * auVar46._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar66._0_4_;
      bVar10 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar57._4_4_ = (uint)bVar10 * auVar46._4_4_ | (uint)!bVar10 * auVar66._4_4_;
      bVar10 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar57._8_4_ = (uint)bVar10 * auVar46._8_4_ | (uint)!bVar10 * auVar66._8_4_;
      bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar57._12_4_ = (uint)bVar10 * auVar46._12_4_ | (uint)!bVar10 * auVar66._12_4_;
      bVar10 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar57._16_4_ = (uint)bVar10 * auVar46._16_4_ | (uint)!bVar10 * auVar66._16_4_;
      bVar10 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar57._20_4_ = (uint)bVar10 * auVar46._20_4_ | (uint)!bVar10 * auVar66._20_4_;
      bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar57._24_4_ = (uint)bVar10 * auVar46._24_4_ | (uint)!bVar10 * auVar66._24_4_;
      bVar10 = SUB81(uVar21 >> 7,0);
      auVar57._28_4_ = (uint)bVar10 * auVar46._28_4_ | (uint)!bVar10 * auVar66._28_4_;
      auVar46 = vmaxps_avx512vl(auVar67,auVar61);
      auVar66._0_4_ = (uint)(bVar9 & 1) * auVar67._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar46._0_4_;
      bVar10 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar66._4_4_ = (uint)bVar10 * auVar67._4_4_ | (uint)!bVar10 * auVar46._4_4_;
      bVar10 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar66._8_4_ = (uint)bVar10 * auVar67._8_4_ | (uint)!bVar10 * auVar46._8_4_;
      bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar66._12_4_ = (uint)bVar10 * auVar67._12_4_ | (uint)!bVar10 * auVar46._12_4_;
      bVar10 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar66._16_4_ = (uint)bVar10 * auVar67._16_4_ | (uint)!bVar10 * auVar46._16_4_;
      bVar10 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar66._20_4_ = (uint)bVar10 * auVar67._20_4_ | (uint)!bVar10 * auVar46._20_4_;
      bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar66._24_4_ = (uint)bVar10 * auVar67._24_4_ | (uint)!bVar10 * auVar46._24_4_;
      bVar10 = SUB81(uVar21 >> 7,0);
      auVar66._28_4_ = (uint)bVar10 * auVar67._28_4_ | (uint)!bVar10 * auVar46._28_4_;
      auVar46 = vmaxps_avx512vl(auVar44,auVar62);
      auVar67._0_4_ = (uint)(bVar9 & 1) * auVar44._0_4_ | (uint)!(bool)(bVar9 & 1) * auVar46._0_4_;
      bVar10 = (bool)((byte)(uVar21 >> 1) & 1);
      auVar67._4_4_ = (uint)bVar10 * auVar44._4_4_ | (uint)!bVar10 * auVar46._4_4_;
      bVar10 = (bool)((byte)(uVar21 >> 2) & 1);
      auVar67._8_4_ = (uint)bVar10 * auVar44._8_4_ | (uint)!bVar10 * auVar46._8_4_;
      bVar10 = (bool)((byte)(uVar21 >> 3) & 1);
      auVar67._12_4_ = (uint)bVar10 * auVar44._12_4_ | (uint)!bVar10 * auVar46._12_4_;
      bVar10 = (bool)((byte)(uVar21 >> 4) & 1);
      auVar67._16_4_ = (uint)bVar10 * auVar44._16_4_ | (uint)!bVar10 * auVar46._16_4_;
      bVar10 = (bool)((byte)(uVar21 >> 5) & 1);
      auVar67._20_4_ = (uint)bVar10 * auVar44._20_4_ | (uint)!bVar10 * auVar46._20_4_;
      bVar10 = (bool)((byte)(uVar21 >> 6) & 1);
      auVar67._24_4_ = (uint)bVar10 * auVar44._24_4_ | (uint)!bVar10 * auVar46._24_4_;
      bVar10 = SUB81(uVar21 >> 7,0);
      auVar67._28_4_ = (uint)bVar10 * auVar44._28_4_ | (uint)!bVar10 * auVar46._28_4_;
      vandps_avx512vl(auVar59,auVar58);
      auVar44 = vmaxps_avx(auVar70,auVar67);
      bVar10 = (bool)((byte)(uVar21 >> 1) & 1);
      bVar11 = (bool)((byte)(uVar21 >> 2) & 1);
      bVar12 = (bool)((byte)(uVar21 >> 3) & 1);
      bVar13 = (bool)((byte)(uVar21 >> 4) & 1);
      bVar14 = (bool)((byte)(uVar21 >> 5) & 1);
      bVar15 = (bool)((byte)(uVar21 >> 6) & 1);
      bVar16 = SUB81(uVar21 >> 7,0);
      auVar71 = ZEXT3264(CONCAT428((uint)bVar16 * auVar71._28_4_ | (uint)!bVar16 * auVar44._28_4_,
                                   CONCAT424((uint)bVar15 * auVar71._24_4_ |
                                             (uint)!bVar15 * auVar44._24_4_,
                                             CONCAT420((uint)bVar14 * auVar71._20_4_ |
                                                       (uint)!bVar14 * auVar44._20_4_,
                                                       CONCAT416((uint)bVar13 * auVar71._16_4_ |
                                                                 (uint)!bVar13 * auVar44._16_4_,
                                                                 CONCAT412((uint)bVar12 *
                                                                           auVar71._12_4_ |
                                                                           (uint)!bVar12 *
                                                                           auVar44._12_4_,
                                                                           CONCAT48((uint)bVar11 *
                                                                                    auVar71._8_4_ |
                                                                                    (uint)!bVar11 *
                                                                                    auVar44._8_4_,
                                                                                    CONCAT44((uint)
                                                  bVar10 * auVar71._4_4_ |
                                                  (uint)!bVar10 * auVar44._4_4_,
                                                  (uint)(bVar9 & 1) * auVar71._0_4_ |
                                                  (uint)!(bool)(bVar9 & 1) * auVar44._0_4_))))))));
      auVar44 = auVar67;
      auVar46 = auVar57;
      auVar67 = auVar66;
      auVar57 = auVar65;
      auVar65 = auVar64;
      auVar66 = auVar63;
    }
    auVar43 = vshufps_avx512vl(auVar65,auVar65,0xb1);
    auVar43 = vminps_avx512vl(auVar65,auVar43);
    auVar65 = vshufpd_avx(auVar43,auVar43,5);
    auVar65 = vminps_avx(auVar43,auVar65);
    auVar37 = vminps_avx(auVar65._0_16_,auVar65._16_16_);
    auVar65 = vshufps_avx512vl(auVar66,auVar66,0xb1);
    auVar65 = vminps_avx512vl(auVar66,auVar65);
    auVar66 = vshufpd_avx(auVar65,auVar65,5);
    auVar66 = vminps_avx(auVar65,auVar66);
    auVar42 = vminps_avx(auVar66._0_16_,auVar66._16_16_);
    auVar42 = vunpcklps_avx(auVar37,auVar42);
    auVar66 = vshufps_avx512vl(auVar57,auVar57,0xb1);
    auVar57 = vminps_avx512vl(auVar57,auVar66);
    auVar66 = vshufpd_avx(auVar57,auVar57,5);
    auVar66 = vminps_avx(auVar57,auVar66);
    auVar37 = vminps_avx(auVar66._0_16_,auVar66._16_16_);
    auVar37 = vinsertps_avx(auVar42,auVar37,0x28);
    auVar66 = vshufps_avx(auVar46,auVar46,0xb1);
    auVar46 = vmaxps_avx(auVar46,auVar66);
    auVar66 = vshufpd_avx(auVar46,auVar46,5);
    auVar46 = vmaxps_avx(auVar46,auVar66);
    auVar42 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
    auVar46 = vshufps_avx(auVar67,auVar67,0xb1);
    auVar46 = vmaxps_avx(auVar67,auVar46);
    auVar67 = vshufpd_avx(auVar46,auVar46,5);
    auVar46 = vmaxps_avx(auVar46,auVar67);
    auVar40 = vmaxps_avx(auVar46._0_16_,auVar46._16_16_);
    auVar40 = vunpcklps_avx(auVar42,auVar40);
    auVar46 = vshufps_avx(auVar44,auVar44,0xb1);
    auVar44 = vmaxps_avx(auVar44,auVar46);
    auVar46 = vshufpd_avx(auVar44,auVar44,5);
    auVar44 = vmaxps_avx(auVar44,auVar46);
    auVar42 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
    auVar42 = vinsertps_avx(auVar40,auVar42,0x28);
    auVar44 = vshufps_avx(auVar70,auVar70,0xb1);
    auVar44 = vmaxps_avx(auVar70,auVar44);
    auVar46 = vshufpd_avx(auVar44,auVar44,5);
    auVar44 = vmaxps_avx(auVar44,auVar46);
    auVar40 = vmaxps_avx(auVar44._0_16_,auVar44._16_16_);
    uVar68 = auVar40._0_4_;
    auVar38._4_4_ = uVar68;
    auVar38._0_4_ = uVar68;
    auVar38._8_4_ = uVar68;
    auVar38._12_4_ = uVar68;
  }
  auVar40 = vsubps_avx(auVar37,auVar38);
  auVar72._0_4_ = auVar42._0_4_ + auVar38._0_4_;
  auVar72._4_4_ = auVar42._4_4_ + auVar38._4_4_;
  auVar72._8_4_ = auVar42._8_4_ + auVar38._8_4_;
  auVar72._12_4_ = auVar42._12_4_ + auVar38._12_4_;
  auVar73._8_4_ = 0x7fffffff;
  auVar73._0_8_ = 0x7fffffff7fffffff;
  auVar73._12_4_ = 0x7fffffff;
  auVar37 = vandps_avx(auVar40,auVar73);
  auVar42 = vandps_avx(auVar72,auVar73);
  auVar37 = vmaxps_avx(auVar37,auVar42);
  auVar42 = vmovshdup_avx(auVar37);
  auVar42 = vmaxss_avx(auVar42,auVar37);
  auVar37 = vshufpd_avx(auVar37,auVar37,1);
  auVar37 = vmaxss_avx(auVar37,auVar42);
  fVar1 = auVar37._0_4_ * 4.7683716e-07;
  auVar37._4_4_ = fVar1;
  auVar37._0_4_ = fVar1;
  auVar37._8_4_ = fVar1;
  auVar37._12_4_ = fVar1;
  aVar2 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vsubps_avx(auVar40,auVar37);
  (__return_storage_ptr__->lower).field_0 = aVar2;
  (__return_storage_ptr__->upper).field_0.m128[0] = auVar72._0_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[1] = auVar72._4_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[2] = auVar72._8_4_ + fVar1;
  (__return_storage_ptr__->upper).field_0.m128[3] = auVar72._12_4_ + fVar1;
  return __return_storage_ptr__;
}

Assistant:

BBox3fa vbounds(const Vec3fa& ofs, const float scale, const float r_scale0, const LinearSpace3fa& space, size_t i, size_t itime = 0) const {
        return bounds(ofs,scale,r_scale0,space,i,itime);
      }